

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O1

string * chapter2::max(string *__return_storage_ptr__,string *t1,string *t2)

{
  pointer pcVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::string::compare((string *)t1);
  if (0 < iVar2) {
    t2 = t1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (t2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + t2->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

string max(string &t1, string &t2) {
        return t1 > t2 ? t1 : t2;
    }